

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

void lws_pps_schedule(lws *wsi,lws_h2_protocol_send *pps)

{
  lws_h2_netconn *plVar1;
  lws *plVar2;
  lws_h2_netconn *h2n;
  lws *nwsi;
  lws_h2_protocol_send *pps_local;
  lws *wsi_local;
  
  plVar2 = lws_get_network_wsi(wsi);
  plVar1 = (plVar2->h2).h2n;
  pps->next = plVar1->pps;
  plVar1->pps = pps;
  lws_rx_flow_control(wsi,0x4080);
  lws_callback_on_writable(wsi);
  return;
}

Assistant:

void
lws_pps_schedule(struct lws *wsi, struct lws_h2_protocol_send *pps)
{
	struct lws *nwsi = lws_get_network_wsi(wsi);
	struct lws_h2_netconn *h2n = nwsi->h2.h2n;

	pps->next = h2n->pps;
	h2n->pps = pps;
	lws_rx_flow_control(wsi, LWS_RXFLOW_REASON_APPLIES_DISABLE |
				 LWS_RXFLOW_REASON_H2_PPS_PENDING);
	lws_callback_on_writable(wsi);
}